

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O2

void __thiscall lsim::ModelWire::simplify(ModelWire *this)

{
  Point *pPVar1;
  Point PVar2;
  ModelWireSegment *this_00;
  ModelWireSegment *this_01;
  ModelWireJunction *pMVar3;
  ModelWireJunction *pMVar4;
  unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_> *junction;
  Point *pPVar5;
  Point points [3];
  vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_> to_check;
  
  to_check.super__Vector_base<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  to_check.super__Vector_base<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  to_check.super__Vector_base<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar1 = (Point *)(this->m_junctions).
                    super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar5 = (Point *)(this->m_junctions).
                         super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pPVar5 != pPVar1;
      pPVar5 = pPVar5 + 1) {
    PVar2 = *pPVar5;
    if (*(long *)((long)PVar2 + 0x10) - *(long *)((long)PVar2 + 8) == 0x10) {
      points[0] = PVar2;
      std::vector<lsim::ModelWireJunction*,std::allocator<lsim::ModelWireJunction*>>::
      emplace_back<lsim::ModelWireJunction*>
                ((vector<lsim::ModelWireJunction*,std::allocator<lsim::ModelWireJunction*>> *)
                 &to_check,(ModelWireJunction **)points);
    }
  }
  while (to_check.
         super__Vector_base<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         to_check.
         super__Vector_base<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>.
         _M_impl.super__Vector_impl_data._M_finish) {
    pMVar4 = to_check.
             super__Vector_base<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1];
    to_check.
    super__Vector_base<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         to_check.
         super__Vector_base<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + -1;
    this_00 = ModelWireJunction::segment(pMVar4,0);
    this_01 = ModelWireJunction::segment(pMVar4,1);
    points[0] = pMVar4->m_position;
    points[1].x = 0.0;
    points[1].y = 0.0;
    points[2].x = 0.0;
    points[2].y = 0.0;
    pMVar3 = ModelWireSegment::junction(this_00,(ulong)((this_00->m_ends)._M_elems[0] == pMVar4));
    points[1] = pMVar3->m_position;
    pMVar4 = ModelWireSegment::junction(this_01,(ulong)((this_01->m_ends)._M_elems[0] == pMVar4));
    points[2] = pMVar4->m_position;
    if (ABS((points[2].y - points[0].y) * (points[1].x - points[0].x) -
            (points[1].y - points[0].y) * (points[2].x - points[0].x)) < 0.001) {
      add_segment(this,points + 1,points + 2);
      remove_redundant_segment(this,this_00);
      remove_redundant_segment(this,this_01);
    }
  }
  std::_Vector_base<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>::
  ~_Vector_base(&to_check.
                 super__Vector_base<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>
               );
  return;
}

Assistant:

void ModelWire::simplify() {
    // duplicate junctions shouldn't happen because of the way wires are merged. Check not implemented.

    // junctions with just two segments should be removed when the segments are colinear
    std::vector<ModelWireJunction *> to_check;

    for (auto &junction : m_junctions) {
        if (junction->num_segments() == 2) {
            to_check.push_back(junction.get());
        }
    }

    while (!to_check.empty()) {
        auto junction = to_check.back();
        to_check.pop_back();

        ModelWireSegment *segments[2] = {junction->segment(0), junction->segment(1)};

        Point points[3] = {junction->position()};
        points[1] = segments[0]->junction(segments[0]->junction(0) == junction ? 1 : 0)->position();
        points[2] = segments[1]->junction(segments[1]->junction(0) == junction ? 1 : 0)->position();

        if (points_colinear(points[0], points[1], points[2])) {
            add_segment(points[1], points[2]);
            remove_redundant_segment(segments[0]);
            remove_redundant_segment(segments[1]);
        }
    }
}